

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O1

int mbedtls_pk_write_pubkey_der(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  mbedtls_pk_type_t pk_alg;
  uint uVar4;
  size_t sVar5;
  uchar *c;
  char *oid;
  size_t oid_len;
  uchar *local_48;
  char *local_40;
  size_t local_38;
  
  uVar4 = 0xffffff94;
  if (size != 0) {
    local_48 = buf + size;
    uVar1 = mbedtls_pk_write_pubkey(&local_48,buf,key);
    uVar4 = uVar1;
    if ((-1 < (int)uVar1) &&
       (uVar4 = 0xffffff94, local_48 != buf && -1 < (long)local_48 - (long)buf)) {
      local_48[-1] = '\0';
      local_48 = local_48 + -1;
      uVar2 = mbedtls_asn1_write_len(&local_48,buf,(ulong)(uVar1 + 1));
      uVar4 = uVar2;
      if ((-1 < (int)uVar2) &&
         (uVar3 = mbedtls_asn1_write_tag(&local_48,buf,'\x03'), uVar4 = uVar3, -1 < (int)uVar3)) {
        pk_alg = mbedtls_pk_get_type(key);
        if (pk_alg == MBEDTLS_PK_ECKEY) {
          uVar4 = pk_write_ec_param(&local_48,buf,(mbedtls_ecp_keypair *)key->pk_ctx);
          if ((int)uVar4 < 0) {
            return uVar4;
          }
          sVar5 = (size_t)uVar4;
        }
        else {
          sVar5 = 0;
        }
        uVar4 = mbedtls_oid_get_oid_by_pk_alg(pk_alg,&local_40,&local_38);
        if ((uVar4 == 0) &&
           (uVar4 = mbedtls_asn1_write_algorithm_identifier(&local_48,buf,local_40,local_38,sVar5),
           -1 < (int)uVar4)) {
          sVar5 = (ulong)uVar4 + (ulong)(uVar1 + 1) + (ulong)uVar3 + (ulong)uVar2;
          uVar1 = mbedtls_asn1_write_len(&local_48,buf,sVar5);
          uVar4 = uVar1;
          if ((-1 < (int)uVar1) &&
             (uVar4 = mbedtls_asn1_write_tag(&local_48,buf,'0'), -1 < (int)uVar4)) {
            uVar4 = uVar1 + (int)sVar5 + uVar4;
          }
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int mbedtls_pk_write_pubkey_der( mbedtls_pk_context *key, unsigned char *buf, size_t size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *c;
    size_t len = 0, par_len = 0, oid_len;
    mbedtls_pk_type_t pk_type;
    const char *oid;

    PK_VALIDATE_RET( key != NULL );
    if( size == 0 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );
    PK_VALIDATE_RET( buf != NULL );

    c = buf + size;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_pk_write_pubkey( &c, buf, key ) );

    if( c - buf < 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    /*
     *  SubjectPublicKeyInfo  ::=  SEQUENCE  {
     *       algorithm            AlgorithmIdentifier,
     *       subjectPublicKey     BIT STRING }
     */
    *--c = 0;
    len += 1;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_BIT_STRING ) );

    pk_type = mbedtls_pk_get_type( key );
#if defined(MBEDTLS_ECP_C)
    if( pk_type == MBEDTLS_PK_ECKEY )
    {
        MBEDTLS_ASN1_CHK_ADD( par_len, pk_write_ec_param( &c, buf, mbedtls_pk_ec( *key ) ) );
    }
#endif
#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( pk_type == MBEDTLS_PK_OPAQUE )
    {
        psa_key_attributes_t attributes = PSA_KEY_ATTRIBUTES_INIT;
        psa_key_type_t key_type;
        psa_key_handle_t handle;
        psa_ecc_curve_t curve;
        size_t bits;

        handle = *((psa_key_handle_t*) key->pk_ctx );
        if( PSA_SUCCESS != psa_get_key_attributes( handle, &attributes ) )
            return( MBEDTLS_ERR_PK_HW_ACCEL_FAILED );
        key_type = psa_get_key_type( &attributes );
        bits = psa_get_key_bits( &attributes );
        psa_reset_key_attributes( &attributes );

        curve = PSA_KEY_TYPE_GET_CURVE( key_type );
        if( curve == 0 )
            return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

        ret = mbedtls_psa_get_ecc_oid_from_id( curve, bits, &oid, &oid_len );
        if( ret != 0 )
            return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );

        /* Write EC algorithm parameters; that's akin
         * to pk_write_ec_param() above. */
        MBEDTLS_ASN1_CHK_ADD( par_len, mbedtls_asn1_write_oid( &c, buf,
                                                               oid, oid_len ) );

        /* The rest of the function works as for legacy EC contexts. */
        pk_type = MBEDTLS_PK_ECKEY;
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

    if( ( ret = mbedtls_oid_get_oid_by_pk_alg( pk_type, &oid,
                                               &oid_len ) ) != 0 )
    {
        return( ret );
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_algorithm_identifier( &c, buf, oid, oid_len,
                                                        par_len ) );

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( &c, buf, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( &c, buf, MBEDTLS_ASN1_CONSTRUCTED |
                                                MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}